

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::OwnFd>_>::ExceptionOr
          (ExceptionOr<kj::Maybe<kj::OwnFd>_> *this,Maybe<kj::OwnFd> *value)

{
  (this->super_ExceptionOrValue).exception.ptr.isSet = false;
  (this->value).ptr.isSet = true;
  Maybe<kj::OwnFd>::Maybe(&(this->value).ptr.field_1.value,value);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}